

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_util.cpp
# Opt level: O3

void annEnclRect(ANNpointArray pa,ANNidxArray pidx,int n,int dim,ANNorthRect *bnds)

{
  ANNpoint pAVar1;
  ANNpoint pAVar2;
  ANNpoint pAVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (0 < dim) {
    pAVar1 = pa[*pidx];
    pAVar2 = bnds->lo;
    pAVar3 = bnds->hi;
    uVar5 = 0;
    do {
      dVar7 = pAVar1[uVar5];
      dVar8 = dVar7;
      if (0 < n) {
        uVar4 = 0;
        dVar9 = dVar7;
        do {
          dVar8 = pa[pidx[uVar4]][uVar5];
          dVar6 = dVar8;
          if ((dVar8 < dVar7) || (dVar6 = dVar7, dVar8 <= dVar9)) {
            dVar7 = dVar6;
            dVar8 = dVar9;
          }
          uVar4 = uVar4 + 1;
          dVar9 = dVar8;
        } while ((uint)n != uVar4);
      }
      pAVar2[uVar5] = dVar7;
      pAVar3[uVar5] = dVar8;
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)dim);
  }
  return;
}

Assistant:

void annEnclRect(ANNpointArray pa,   // point array
                 ANNidxArray pidx,   // point indices
                 int n,              // number of points
                 int dim,            // dimension
                 ANNorthRect &bnds)  // bounding cube (returned)
{
    for (int d = 0; d < dim; d++) {  // find smallest enclosing rectangle
        ANNcoord lo_bnd = PA(0, d);  // lower bound on dimension d
        ANNcoord hi_bnd = PA(0, d);  // upper bound on dimension d
        for (int i = 0; i < n; i++) {
            if (PA(i, d) < lo_bnd)
                lo_bnd = PA(i, d);
            else if (PA(i, d) > hi_bnd)
                hi_bnd = PA(i, d);
        }
        bnds.lo[d] = lo_bnd;
        bnds.hi[d] = hi_bnd;
    }
}